

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_certificate_chain.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_12::PathVerifier::ApplyPolicyConstraints
          (PathVerifier *this,ParsedCertificate *cert)

{
  ParsedPolicyConstraints *pPVar1;
  byte *pbVar2;
  
  if (cert->has_policy_constraints_ == true) {
    pPVar1 = ParsedCertificate::policy_constraints(cert);
    if ((pPVar1->require_explicit_policy).super__Optional_base<unsigned_char,_true,_true>._M_payload
        .super__Optional_payload_base<unsigned_char>._M_engaged == true) {
      pPVar1 = ParsedCertificate::policy_constraints(cert);
      pbVar2 = ::std::optional<unsigned_char>::value(&pPVar1->require_explicit_policy);
      if ((ulong)*pbVar2 < this->explicit_policy_) {
        pPVar1 = ParsedCertificate::policy_constraints(cert);
        pbVar2 = ::std::optional<unsigned_char>::value(&pPVar1->require_explicit_policy);
        this->explicit_policy_ = (ulong)*pbVar2;
      }
    }
    pPVar1 = ParsedCertificate::policy_constraints(cert);
    if ((pPVar1->inhibit_policy_mapping).super__Optional_base<unsigned_char,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_char>._M_engaged == true) {
      pPVar1 = ParsedCertificate::policy_constraints(cert);
      pbVar2 = ::std::optional<unsigned_char>::value(&pPVar1->inhibit_policy_mapping);
      if ((ulong)*pbVar2 < this->policy_mapping_) {
        pPVar1 = ParsedCertificate::policy_constraints(cert);
        pbVar2 = ::std::optional<unsigned_char>::value(&pPVar1->inhibit_policy_mapping);
        this->policy_mapping_ = (ulong)*pbVar2;
      }
    }
  }
  if ((cert->inhibit_any_policy_).super__Optional_base<unsigned_char,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_char>._M_engaged == true) {
    pbVar2 = ::std::optional<unsigned_char>::value(&cert->inhibit_any_policy_);
    if ((ulong)*pbVar2 < this->inhibit_any_policy_) {
      pbVar2 = ::std::optional<unsigned_char>::value(&cert->inhibit_any_policy_);
      this->inhibit_any_policy_ = (ulong)*pbVar2;
    }
  }
  return;
}

Assistant:

void PathVerifier::ApplyPolicyConstraints(const ParsedCertificate &cert) {
  // RFC 5280 section 6.1.4 step i-j:
  //      (i)  If a policy constraints extension is included in the
  //           certificate, modify the explicit_policy and policy_mapping
  //           state variables as follows:
  if (cert.has_policy_constraints()) {
    //         (1)  If requireExplicitPolicy is present and is less than
    //              explicit_policy, set explicit_policy to the value of
    //              requireExplicitPolicy.
    if (cert.policy_constraints().require_explicit_policy &&
        cert.policy_constraints().require_explicit_policy.value() <
            explicit_policy_) {
      explicit_policy_ =
          cert.policy_constraints().require_explicit_policy.value();
    }

    //         (2)  If inhibitPolicyMapping is present and is less than
    //              policy_mapping, set policy_mapping to the value of
    //              inhibitPolicyMapping.
    if (cert.policy_constraints().inhibit_policy_mapping &&
        cert.policy_constraints().inhibit_policy_mapping.value() <
            policy_mapping_) {
      policy_mapping_ =
          cert.policy_constraints().inhibit_policy_mapping.value();
    }
  }

  //      (j)  If the inhibitAnyPolicy extension is included in the
  //           certificate and is less than inhibit_anyPolicy, set
  //           inhibit_anyPolicy to the value of inhibitAnyPolicy.
  if (cert.inhibit_any_policy() &&
      cert.inhibit_any_policy().value() < inhibit_any_policy_) {
    inhibit_any_policy_ = cert.inhibit_any_policy().value();
  }
}